

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_resize(REF_INTERP ref_interp,REF_INT max)

{
  REF_BOOL *__ptr;
  REF_INT *pRVar1;
  REF_DBL *__ptr_00;
  long lVar2;
  undefined8 uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  undefined8 uStack_40;
  
  uVar6 = (ulong)(uint)max;
  lVar5 = (long)ref_interp->max;
  fflush(_stdout);
  __ptr = ref_interp->agent_hired;
  if (0 < max) {
    __ptr = (REF_BOOL *)realloc(__ptr,uVar6 * 4);
    ref_interp->agent_hired = __ptr;
  }
  lVar8 = (long)max;
  lVar2 = lVar5;
  if (__ptr == (REF_BOOL *)0x0) {
    pcVar7 = "realloc ref_interp->agent_hired NULL";
    uVar3 = 0xd1;
  }
  else {
    for (; lVar2 < lVar8; lVar2 = lVar2 + 1) {
      __ptr[lVar2] = 0;
    }
    fflush(_stdout);
    pRVar1 = ref_interp->cell;
    if (0 < max) {
      pRVar1 = (REF_INT *)realloc(pRVar1,uVar6 * 4);
      ref_interp->cell = pRVar1;
    }
    lVar2 = lVar5;
    if (pRVar1 == (REF_INT *)0x0) {
      pcVar7 = "realloc ref_interp->cell NULL";
      uVar3 = 0xd2;
    }
    else {
      for (; lVar2 < lVar8; lVar2 = lVar2 + 1) {
        pRVar1[lVar2] = -1;
      }
      fflush(_stdout);
      pRVar1 = ref_interp->part;
      if (0 < max) {
        pRVar1 = (REF_INT *)realloc(pRVar1,uVar6 << 2);
        ref_interp->part = pRVar1;
      }
      if (pRVar1 != (REF_INT *)0x0) {
        for (; lVar5 < lVar8; lVar5 = lVar5 + 1) {
          pRVar1[lVar5] = -1;
        }
        fflush(_stdout);
        uVar4 = max * 4;
        __ptr_00 = ref_interp->bary;
        if (0 < max) {
          __ptr_00 = (REF_DBL *)realloc(__ptr_00,(ulong)uVar4 << 3);
          ref_interp->bary = __ptr_00;
        }
        if (__ptr_00 != (REF_DBL *)0x0) {
          ref_interp->max = max;
          return 0;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xd4,"ref_interp_resize","realloc ref_interp->bary NULL");
        lVar8 = (long)(int)uVar4;
        lVar5 = lVar8 * 8;
        uStack_40 = 8;
        uVar6 = (ulong)uVar4;
        goto LAB_001296ec;
      }
      pcVar7 = "realloc ref_interp->part NULL";
      uVar3 = 0xd3;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar3,
         "ref_interp_resize",pcVar7);
  lVar5 = lVar8 * 4;
  uStack_40 = 4;
LAB_001296ec:
  printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar6,lVar8,uStack_40,lVar5);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_resize(REF_INTERP ref_interp, REF_INT max) {
  REF_INT old = ref_interp_max(ref_interp);

  ref_realloc_init(ref_interp->agent_hired, old, max, REF_BOOL, REF_FALSE);
  ref_realloc_init(ref_interp->cell, old, max, REF_INT, REF_EMPTY);
  ref_realloc_init(ref_interp->part, old, max, REF_INT, REF_EMPTY);
  ref_realloc(ref_interp->bary, 4 * max, REF_DBL);

  ref_interp_max(ref_interp) = max;

  return REF_SUCCESS;
}